

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BMPattern.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::BMPattern::BMPattern
          (BMPattern *this,XMLCh *pattern,bool ignoreCase,MemoryManager *manager)

{
  short *psVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t __n;
  CleanupType_conflict cleanup;
  JanitorMemFunCall<xercesc_4_0::BMPattern> local_38;
  XMLCh *__dest;
  
  this->fIgnoreCase = ignoreCase;
  this->fShiftTableLen = 0x100;
  this->fShiftTable = (XMLSize_t *)0x0;
  this->fPattern = (XMLCh *)0x0;
  __dest = (XMLCh *)0x0;
  this->fUppercasePattern = (XMLCh *)0x0;
  this->fMemoryManager = manager;
  local_38.fToCall = (MFPT)cleanUp;
  local_38._16_8_ = 0;
  local_38.fObject = this;
  if (pattern != (XMLCh *)0x0) {
    __n = 0;
    do {
      psVar1 = (short *)((long)pattern + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,__n);
    __dest = (XMLCh *)CONCAT44(extraout_var,iVar2);
    memcpy(__dest,pattern,__n);
  }
  this->fPattern = __dest;
  initialize(this);
  local_38.fObject = (BMPattern *)0x0;
  JanitorMemFunCall<xercesc_4_0::BMPattern>::~JanitorMemFunCall(&local_38);
  return;
}

Assistant:

BMPattern::BMPattern( const XMLCh*         const pattern
                    ,       bool                 ignoreCase
                    ,       MemoryManager* const manager) :

    fIgnoreCase(ignoreCase)
    , fShiftTableLen(256)
    , fShiftTable(0)
    , fPattern(0)
    , fUppercasePattern(0)
    , fMemoryManager(manager)
{
    CleanupType cleanup(this, &BMPattern::cleanUp);

    try {
        fPattern = XMLString::replicate(pattern, fMemoryManager);
        initialize();
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}